

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

klass class_create(char *name,accessor_type_id accessor,class_impl impl,
                  class_impl_interface_singleton singleton)

{
  int iVar1;
  klass __ptr;
  size_t sVar2;
  char *__dest;
  class_interface pcVar3;
  vector pvVar4;
  map pmVar5;
  set psVar6;
  
  __ptr = (klass)malloc(0x50);
  if (__ptr == (klass)0x0) {
    return (klass)0x0;
  }
  if (name == (char *)0x0) {
    __ptr->name = (char *)0x0;
  }
  else {
    sVar2 = strlen(name);
    __dest = (char *)malloc(sVar2 + 1);
    __ptr->name = __dest;
    if (__dest == (char *)0x0) {
      log_write_impl_va("metacall",0x5f,"class_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class name allocation <%s>",name);
      goto LAB_0011c2ac;
    }
    memcpy(__dest,name,sVar2 + 1);
  }
  __ptr->impl = impl;
  __ptr->accessor = accessor;
  pcVar3 = (class_interface)0x0;
  LOCK();
  (__ptr->ref).count = 0;
  UNLOCK();
  if (singleton != (class_impl_interface_singleton)0x0) {
    pcVar3 = (*singleton)();
  }
  __ptr->interface = pcVar3;
  pvVar4 = vector_create(8);
  __ptr->constructors = pvVar4;
  pmVar5 = map_create(hash_callback_str,comparable_callback_str);
  __ptr->methods = pmVar5;
  pmVar5 = map_create(hash_callback_str,comparable_callback_str);
  __ptr->static_methods = pmVar5;
  psVar6 = set_create(hash_callback_str,comparable_callback_str);
  __ptr->attributes = psVar6;
  psVar6 = set_create(hash_callback_str,comparable_callback_str);
  __ptr->static_attributes = psVar6;
  if (((pcVar3 == (class_interface)0x0) || (pcVar3->create == (class_impl_interface_create)0x0)) ||
     (iVar1 = (*pcVar3->create)(__ptr,impl), iVar1 == 0)) {
    LOCK();
    class_stats.allocations = class_stats.allocations + 1;
    UNLOCK();
    return __ptr;
  }
  log_write_impl_va("metacall",0x7b,"class_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                    ,LOG_LEVEL_ERROR,"Invalid class (%s) create callback <%p>",__ptr->name,
                    __ptr->interface->create);
  free(__ptr->name);
  vector_destroy(__ptr->constructors);
  map_destroy(__ptr->methods);
  map_destroy(__ptr->static_methods);
  set_destroy(__ptr->attributes);
  set_destroy(__ptr->static_attributes);
LAB_0011c2ac:
  free(__ptr);
  return (klass)0x0;
}

Assistant:

klass class_create(const char *name, enum accessor_type_id accessor, class_impl impl, class_impl_interface_singleton singleton)
{
	klass cls = malloc(sizeof(struct class_type));

	if (cls == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t cls_name_size = strlen(name) + 1;

		cls->name = malloc(sizeof(char) * cls_name_size);

		if (cls->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class name allocation <%s>", name);

			free(cls);

			return NULL;
		}

		memcpy(cls->name, name, cls_name_size);
	}
	else
	{
		cls->name = NULL;
	}

	cls->impl = impl;
	cls->accessor = accessor;
	threading_atomic_ref_count_initialize(&cls->ref);
	cls->interface = singleton ? singleton() : NULL;
	cls->constructors = vector_create_type(constructor);
	cls->methods = map_create(&hash_callback_str, &comparable_callback_str);
	cls->static_methods = map_create(&hash_callback_str, &comparable_callback_str);
	cls->attributes = set_create(&hash_callback_str, &comparable_callback_str);
	cls->static_attributes = set_create(&hash_callback_str, &comparable_callback_str);

	if (cls->interface != NULL && cls->interface->create != NULL)
	{
		if (cls->interface->create(cls, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class (%s) create callback <%p>", cls->name, cls->interface->create);

			free(cls->name);
			vector_destroy(cls->constructors);
			map_destroy(cls->methods);
			map_destroy(cls->static_methods);
			set_destroy(cls->attributes);
			set_destroy(cls->static_attributes);
			free(cls);

			return NULL;
		}
	}

	reflect_memory_tracker_allocation(class_stats);

	return cls;
}